

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS
ref_fixture_tet_brick_args_grid
          (REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,REF_DBL y1,
          REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dz;
  REF_DBL dy;
  REF_DBL dx;
  int local_e0;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_INT tri [4];
  REF_INT quad [5];
  REF_INT local_ac;
  int local_a8;
  REF_INT cell;
  REF_INT tet [4];
  REF_INT hex [8];
  REF_INT node;
  REF_INT global;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INT n_local;
  REF_INT m_local;
  REF_INT l_local;
  REF_DBL z1_local;
  REF_DBL z0_local;
  REF_DBL y1_local;
  REF_DBL y0_local;
  REF_DBL x1_local;
  REF_DBL x0_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (ref_grid_ptr_local._4_4_ == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node_00 = pRVar1->node;
    if (pRVar1->mpi->id == 0) {
      for (dx._4_4_ = 0; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_e0 = 0; local_e0 < m; local_e0 = local_e0 + 1) {
          for (k = 0; k < l; k = k + 1) {
            hex[7] = k + local_e0 * l + dx._4_4_ * l * m;
            uVar2 = ref_node_add(ref_node_00,(long)hex[7],hex + 6);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x66b,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"node");
              return uVar2;
            }
            ref_node_00->real[hex[6] * 0xf] = ((x1 - x0) / (double)(l + -1)) * (double)k + x0;
            ref_node_00->real[hex[6] * 0xf + 1] =
                 ((y1 - y0) / (double)(m + -1)) * (double)local_e0 + y0;
            ref_node_00->real[hex[6] * 0xf + 2] =
                 ((z1 - z0) / (double)(n + -1)) * (double)dx._4_4_ + z0;
          }
        }
      }
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_e0 = 1; local_e0 < m; local_e0 = local_e0 + 1) {
          for (k = 1; k < l; k = k + 1) {
            local_a8 = k + -1 + (local_e0 + -1) * l + (dx._4_4_ + -1) * l * m;
            cell = k + (local_e0 + -1) * l + (dx._4_4_ + -1) * l * m;
            hex[0] = k + local_e0 * l + (dx._4_4_ + -1) * l * m;
            tet[0] = k + -1 + local_e0 * l + (dx._4_4_ + -1) * l * m;
            tet[1] = k + -1 + (local_e0 + -1) * l + dx._4_4_ * l * m;
            hex[3] = k + (local_e0 + -1) * l + dx._4_4_ * l * m;
            hex[4] = k + local_e0 * l + dx._4_4_ * l * m;
            hex[5] = k + -1 + local_e0 * l + dx._4_4_ * l * m;
            tet[2] = local_a8;
            tet[3] = cell;
            hex[1] = tet[0];
            hex[2] = tet[1];
            uVar2 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x683,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
              return uVar2;
            }
            local_a8 = tet[3];
            cell = hex[1];
            tet[0] = hex[2];
            tet[1] = hex[3];
            uVar2 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x688,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
              return uVar2;
            }
            local_a8 = hex[1];
            cell = hex[2];
            tet[0] = hex[3];
            tet[1] = hex[5];
            uVar2 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x68d,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
              return uVar2;
            }
            local_a8 = tet[3];
            cell = hex[0];
            tet[0] = hex[1];
            tet[1] = hex[3];
            uVar2 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x692,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
              return uVar2;
            }
            local_a8 = hex[0];
            cell = hex[1];
            tet[0] = hex[3];
            tet[1] = hex[5];
            uVar2 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x697,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
              return uVar2;
            }
            local_a8 = hex[0];
            cell = hex[5];
            tet[0] = hex[3];
            tet[1] = hex[4];
            uVar2 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x69c,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
              return uVar2;
            }
          }
        }
      }
      tri[1] = 1;
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_e0 = 1; local_e0 < m; local_e0 = local_e0 + 1) {
          j = (local_e0 + -1) * l + (dx._4_4_ + -1) * l * m;
          tet[3] = (local_e0 + -1) * l + 1 + (dx._4_4_ + -1) * l * m;
          hex[0] = local_e0 * l + 1 + (dx._4_4_ + -1) * l * m;
          i = local_e0 * l + (dx._4_4_ + -1) * l * m;
          iVar3 = (local_e0 + -1) * l + dx._4_4_ * l * m;
          hex[3] = (local_e0 + -1) * l + 1 + dx._4_4_ * l * m;
          hex[4] = local_e0 * l + 1 + dx._4_4_ * l * m;
          iVar4 = local_e0 * l + dx._4_4_ * l * m;
          tri[0] = iVar3;
          tri[2] = j;
          tri[3] = i;
          tet[2] = j;
          hex[1] = i;
          hex[2] = iVar3;
          hex[5] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6ac,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
          j = tri[3];
          i = iVar4;
          tri[0] = iVar3;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6b0,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      tri[1] = 2;
      iVar3 = l + -1;
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (local_e0 = 1; local_e0 < m; local_e0 = local_e0 + 1) {
          tet[2] = l + -2 + (local_e0 + -1) * l + (dx._4_4_ + -1) * l * m;
          i = iVar3 + (local_e0 + -1) * l + (dx._4_4_ + -1) * l * m;
          j = iVar3 + local_e0 * l + (dx._4_4_ + -1) * l * m;
          hex[1] = l + -2 + local_e0 * l + (dx._4_4_ + -1) * l * m;
          hex[2] = l + -2 + (local_e0 + -1) * l + dx._4_4_ * l * m;
          iVar4 = iVar3 + (local_e0 + -1) * l + dx._4_4_ * l * m;
          iVar5 = iVar3 + local_e0 * l + dx._4_4_ * l * m;
          hex[5] = l + -2 + local_e0 * l + dx._4_4_ * l * m;
          tri[0] = iVar4;
          tri[2] = j;
          tri[3] = i;
          tet[3] = i;
          hex[0] = j;
          hex[3] = iVar4;
          hex[4] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6c0,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
          j = tri[2];
          i = iVar4;
          tri[0] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6c4,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      tri[1] = 3;
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (k = 1; k < l; k = k + 1) {
          i = k + -1 + (dx._4_4_ + -1) * l * m;
          j = k + (dx._4_4_ + -1) * l * m;
          hex[0] = k + l + (dx._4_4_ + -1) * l * m;
          hex[1] = k + -1 + l + (dx._4_4_ + -1) * l * m;
          iVar3 = k + -1 + dx._4_4_ * l * m;
          iVar4 = k + dx._4_4_ * l * m;
          hex[4] = k + l + dx._4_4_ * l * m;
          hex[5] = k + -1 + l + dx._4_4_ * l * m;
          tri[0] = iVar3;
          tri[2] = j;
          tri[3] = i;
          tet[2] = i;
          tet[3] = j;
          hex[2] = iVar3;
          hex[3] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6d4,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
          j = tri[2];
          i = iVar3;
          tri[0] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6d8,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      tri[1] = 4;
      iVar3 = m + -1;
      for (dx._4_4_ = 1; dx._4_4_ < n; dx._4_4_ = dx._4_4_ + 1) {
        for (k = 1; k < l; k = k + 1) {
          tet[2] = k + -1 + (m + -2) * l + (dx._4_4_ + -1) * l * m;
          tet[3] = k + (m + -2) * l + (dx._4_4_ + -1) * l * m;
          i = k + iVar3 * l + (dx._4_4_ + -1) * l * m;
          j = k + -1 + iVar3 * l + (dx._4_4_ + -1) * l * m;
          hex[2] = k + -1 + (m + -2) * l + dx._4_4_ * l * m;
          hex[3] = k + (m + -2) * l + dx._4_4_ * l * m;
          iVar4 = k + iVar3 * l + dx._4_4_ * l * m;
          iVar5 = k + -1 + iVar3 * l + dx._4_4_ * l * m;
          tri[0] = iVar5;
          tri[2] = j;
          tri[3] = i;
          hex[0] = i;
          hex[1] = j;
          hex[4] = iVar4;
          hex[5] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6e8,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
          j = tri[3];
          i = iVar4;
          tri[0] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6ec,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      tri[1] = 5;
      for (local_e0 = 1; local_e0 < m; local_e0 = local_e0 + 1) {
        for (k = 1; k < l; k = k + 1) {
          j = k + -1 + (local_e0 + -1) * l;
          i = k + (local_e0 + -1) * l;
          iVar3 = k + local_e0 * l;
          iVar4 = k + -1 + local_e0 * l;
          hex[2] = k + -1 + (local_e0 + -1) * l + l * m;
          hex[3] = k + (local_e0 + -1) * l + l * m;
          hex[4] = k + local_e0 * l + l * m;
          hex[5] = k + -1 + local_e0 * l + l * m;
          tri[0] = iVar4;
          tri[2] = j;
          tri[3] = i;
          tet[2] = j;
          tet[3] = i;
          hex[0] = iVar3;
          hex[1] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x6fc,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
          j = tri[3];
          i = iVar3;
          tri[0] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x700,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      tri[1] = 6;
      iVar3 = n + -1;
      for (local_e0 = 1; local_e0 < m; local_e0 = local_e0 + 1) {
        for (k = 1; k < l; k = k + 1) {
          tet[2] = k + -1 + (local_e0 + -1) * l + (n + -2) * l * m;
          tet[3] = k + (local_e0 + -1) * l + (n + -2) * l * m;
          hex[0] = k + local_e0 * l + (n + -2) * l * m;
          hex[1] = k + -1 + local_e0 * l + (n + -2) * l * m;
          i = k + -1 + (local_e0 + -1) * l + iVar3 * l * m;
          j = k + (local_e0 + -1) * l + iVar3 * l * m;
          iVar4 = k + local_e0 * l + iVar3 * l * m;
          iVar5 = k + -1 + local_e0 * l + iVar3 * l * m;
          tri[0] = iVar5;
          tri[2] = j;
          tri[3] = i;
          hex[2] = i;
          hex[3] = j;
          hex[4] = iVar4;
          hex[5] = iVar5;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x710,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
          j = tri[2];
          i = iVar5;
          tri[0] = iVar4;
          uVar2 = ref_cell_add(pRVar1->cell[3],&j,&local_ac);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x714,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(l * m * n));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x717,"ref_fixture_tet_brick_args_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
    else {
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(l * m * n));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x661,"ref_fixture_tet_brick_args_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x65c
           ,"ref_fixture_tet_brick_args_grid",(ulong)ref_grid_ptr_local._4_4_,"create");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], tet[4], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        tet[0] = hex[0];
        tet[1] = hex[1];
        tet[2] = hex[3];
        tet[3] = hex[4];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[3];
        tet[2] = hex[4];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[3];
        tet[1] = hex[4];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[2];
        tet[2] = hex[3];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[3];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[7];
        tet[2] = hex[5];
        tet[3] = hex[6];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
      }

  quad[4] = 1;
  tri[3] = quad[4];
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 2;
  tri[3] = quad[4];
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 3;
  tri[3] = quad[4];
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 4;
  tri[3] = quad[4];
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}